

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl.c
# Opt level: O0

int uv__dlerror(uv_lib_t *lib)

{
  char *pcVar1;
  long in_RDI;
  char *errmsg;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 8) != 0) {
    free(*(void **)(in_RDI + 8));
  }
  pcVar1 = (char *)dlerror();
  if (pcVar1 == (char *)0x0) {
    *(undefined8 *)(in_RDI + 8) = 0;
    local_4 = 0;
  }
  else {
    pcVar1 = strdup(pcVar1);
    *(char **)(in_RDI + 8) = pcVar1;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int uv__dlerror(uv_lib_t* lib) {
  const char* errmsg;

  if (lib->errmsg)
    free(lib->errmsg);

  errmsg = dlerror();

  if (errmsg) {
    lib->errmsg = strdup(errmsg);
    return -1;
  }
  else {
    lib->errmsg = NULL;
    return 0;
  }
}